

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::io::SZipFileEntry>::reallocate
          (array<irr::io::SZipFileEntry> *this,u32 new_size,bool canShrink)

{
  size_type sVar1;
  byte in_DL;
  uint in_ESI;
  vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_> *in_RDI;
  vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_> *unaff_retaddr;
  size_type in_stack_00000008;
  size_t allocated;
  
  sVar1 = ::std::vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>::capacity
                    (in_RDI);
  if (in_ESI < sVar1) {
    if ((in_DL & 1) != 0) {
      ::std::vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>::resize
                (unaff_retaddr,(size_type)in_RDI);
    }
  }
  else {
    ::std::vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>::reserve
              ((vector<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_> *)allocated,
               in_stack_00000008);
  }
  return;
}

Assistant:

void reallocate(u32 new_size, bool canShrink = true)
	{
		size_t allocated = m_data.capacity();
		if (new_size < allocated) {
			if (canShrink)
				m_data.resize(new_size);
		} else {
			m_data.reserve(new_size);
		}
	}